

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *args_2;
  AttributeInstanceSyntax *pAVar1;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::AttributeSpecSyntax>
                     ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)(__fn + 0x38),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AttributeInstanceSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,args_2,&local_60,&local_70)
  ;
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AttributeInstanceSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AttributeInstanceSyntax>(
        node.openParen.deepClone(alloc),
        node.openStar.deepClone(alloc),
        *deepClone(node.specs, alloc),
        node.closeStar.deepClone(alloc),
        node.closeParen.deepClone(alloc)
    );
}